

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmfilelockmgr.cpp
# Opt level: O0

PAL_ERROR FILEUnlockFileRegion
                    (SHMPTR shmFileLocks,PVOID pvControllerInstance,UINT64 unlockRgnStart,
                    UINT64 nbBytesToUnlock,LOCK_TYPE unlockType)

{
  DWORD DVar1;
  bool bVar2;
  LPVOID local_80;
  SHMFILELOCKS *fileLocks;
  SHMPTR shmcurLockRgn;
  SHMFILELOCKRGNS unlockRgn;
  SHMFILELOCKRGNS *curLockRgn;
  SHMFILELOCKRGNS *prevLock;
  PAL_ERROR palError;
  LOCK_TYPE unlockType_local;
  UINT64 nbBytesToUnlock_local;
  UINT64 unlockRgnStart_local;
  PVOID pvControllerInstance_local;
  SHMPTR shmFileLocks_local;
  
  prevLock._0_4_ = 0;
  curLockRgn = (SHMFILELOCKRGNS *)0x0;
  SHMLock();
  if (nbBytesToUnlock == 0) {
    prevLock._0_4_ = 0x9e;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else {
    if (shmFileLocks == 0) {
      local_80 = (LPVOID)0x0;
      bVar2 = true;
    }
    else {
      local_80 = SHMPtrToPtr(shmFileLocks);
      bVar2 = local_80 != (LPVOID)0x0;
    }
    if ((bVar2) && (local_80 != (LPVOID)0x0)) {
      if (*(long *)((long)local_80 + 8) == 0) {
        unlockRgn.next = 0;
        bVar2 = true;
      }
      else {
        unlockRgn.next = (SHMPTR)SHMPtrToPtr(*(SHMPTR *)((long)local_80 + 8));
        bVar2 = (LPVOID)unlockRgn.next != (LPVOID)0x0;
      }
      if (bVar2) {
        DVar1 = GetCurrentProcessId();
        fileLocks = *(SHMFILELOCKS **)((long)local_80 + 8);
        do {
          bVar2 = false;
          if (unlockRgn.next != 0) {
            bVar2 = false;
            if ((((*(DWORD *)unlockRgn.next == DVar1) &&
                 (bVar2 = false, *(PVOID *)(unlockRgn.next + 8) == pvControllerInstance)) &&
                (bVar2 = false, *(UINT64 *)(unlockRgn.next + 0x10) == unlockRgnStart)) &&
               (bVar2 = false, *(UINT64 *)(unlockRgn.next + 0x18) == nbBytesToUnlock)) {
              bVar2 = *(LOCK_TYPE *)(unlockRgn.next + 0x20) == unlockType;
            }
            bVar2 = (bool)(bVar2 ^ 1);
          }
          if (!bVar2) {
            if (unlockRgn.next == 0) {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              prevLock._0_4_ = 0x9e;
            }
            else {
              if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
                abort();
              }
              if (curLockRgn == (SHMFILELOCKRGNS *)0x0) {
                *(undefined8 *)((long)local_80 + 8) = *(undefined8 *)(unlockRgn.next + 0x28);
              }
              else {
                curLockRgn->next = *(SHMPTR *)(unlockRgn.next + 0x28);
              }
              SHMfree((SHMPTR)fileLocks);
            }
            goto LAB_0014830e;
          }
          curLockRgn = (SHMFILELOCKRGNS *)unlockRgn.next;
          fileLocks = *(SHMFILELOCKS **)(unlockRgn.next + 0x28);
          if (fileLocks == (SHMFILELOCKS *)0x0) {
            unlockRgn.next = 0;
            bVar2 = true;
          }
          else {
            unlockRgn.next = (SHMPTR)SHMPtrToPtr((SHMPTR)fileLocks);
            bVar2 = (LPVOID)unlockRgn.next != (LPVOID)0x0;
          }
        } while (bVar2);
        fprintf(_stderr,"] %s %s:%d","FILEUnlockFileRegion",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
                ,0x28c);
        fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
        goto LAB_0014830e;
      }
    }
    fprintf(_stderr,"] %s %s:%d","FILEUnlockFileRegion",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/shmfilelockmgr.cpp"
            ,0x279);
    fprintf(_stderr,"Unable to get pointer from shm pointer.\n");
    prevLock._0_4_ = 0x54f;
  }
LAB_0014830e:
  SHMRelease();
  return (PAL_ERROR)prevLock;
}

Assistant:

PAL_ERROR
FILEUnlockFileRegion(
    SHMPTR shmFileLocks,
    PVOID pvControllerInstance,
    UINT64 unlockRgnStart, 
    UINT64 nbBytesToUnlock,
    LOCK_TYPE unlockType
    )
{
    PAL_ERROR palError = NO_ERROR;
    SHMFILELOCKRGNS *prevLock = NULL, *curLockRgn = NULL, unlockRgn;
    SHMPTR shmcurLockRgn;
    SHMFILELOCKS *fileLocks;

    SHMLock();

    
    /* check if the region to unlock is empty or not */
    if (nbBytesToUnlock == 0) 
    {
        palError = ERROR_NOT_LOCKED;
        WARN("Attempt to unlock an empty region\n");
        goto EXIT;
    }
    
    if ((SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKS, fileLocks, shmFileLocks) == FALSE) || 
        (fileLocks == NULL) ||
        (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, fileLocks->fileLockedRgns) == FALSE))
    {
        ASSERT("Unable to get pointer from shm pointer.\n");
        palError = ERROR_INTERNAL_ERROR;
        goto EXIT;
    }
    
    unlockRgn.processId = GetCurrentProcessId();
    unlockRgn.pvControllerInstance = pvControllerInstance;
    unlockRgn.lockRgnStart = unlockRgnStart;
    unlockRgn.nbBytesLocked = nbBytesToUnlock;
    unlockRgn.lockType = unlockType;

    shmcurLockRgn = fileLocks->fileLockedRgns;
    
    while((curLockRgn != NULL) && !IS_LOCK_EQUAL(curLockRgn, &unlockRgn))
    {
        prevLock = curLockRgn; 
        shmcurLockRgn = curLockRgn->next;
        if (SHMPTR_TO_TYPED_PTR_BOOL(SHMFILELOCKRGNS, curLockRgn, shmcurLockRgn) == FALSE)
        {
            ASSERT("Unable to get pointer from shm pointer.\n");
            goto EXIT;
        }
    }
    
    if (curLockRgn != NULL) 
    {
        TRACE("removing the lock region (%I64u, %I64u)\n", 
               curLockRgn->lockRgnStart, curLockRgn->nbBytesLocked);

        if (prevLock == NULL) 
        {
            /* removing the first lock */
            fileLocks->fileLockedRgns = curLockRgn->next;
        }
        else
        {
            prevLock->next = curLockRgn->next;
        }
        SHMfree(shmcurLockRgn);
    }
    else
    {
        /* the lock doesn't exist */
        WARN("Attempt to unlock a non locked region\n");
        palError = ERROR_NOT_LOCKED;
        goto EXIT;
    }
    
EXIT:    
    SHMRelease();
    return palError;
}